

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_socket_comm.c
# Opt level: O1

TPM_SOCKET_HANDLE tpm_socket_create(char *address,unsigned_short port)

{
  int __fd;
  in_addr_t iVar1;
  int iVar2;
  TPM_SOCKET_HANDLE __ptr;
  LOGGER_LOG p_Var3;
  sockaddr_in SockAddr;
  sockaddr local_38;
  
  __ptr = (TPM_SOCKET_HANDLE)malloc(0x18);
  if (__ptr == (TPM_SOCKET_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_socket_comm.c"
                ,"tpm_socket_create",0xcc,1,"Failure: malloc socket communication info.");
      return (TPM_SOCKET_HANDLE)0x0;
    }
  }
  else {
    *(undefined8 *)__ptr = 0;
    __ptr->recv_bytes = (uchar *)0x0;
    __ptr->recv_length = 0;
    __fd = socket(2,1,0);
    __ptr->socket_conn = __fd;
    if (__fd == -1) {
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_socket_comm.c"
                  ,"tpm_socket_create",0xd9,1,"Failure: connecting to tpm simulator.");
      }
    }
    else {
      local_38.sa_data[6] = '\0';
      local_38.sa_data[7] = '\0';
      local_38.sa_data[8] = '\0';
      local_38.sa_data[9] = '\0';
      local_38.sa_data[10] = '\0';
      local_38.sa_data[0xb] = '\0';
      local_38.sa_data[0xc] = '\0';
      local_38.sa_data[0xd] = '\0';
      local_38.sa_data._0_2_ = port << 8 | port >> 8;
      local_38.sa_family = 2;
      local_38.sa_data._2_4_ = 0;
      iVar1 = inet_addr(address);
      local_38.sa_data._2_4_ = iVar1;
      iVar2 = connect(__fd,&local_38,0x10);
      if (-1 < iVar2) {
        return __ptr;
      }
      p_Var3 = xlogging_get_log_function();
      if (p_Var3 != (LOGGER_LOG)0x0) {
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-utpm-c/src/tpm_socket_comm.c"
                  ,"tpm_socket_create",0xe7,1,"Failure: connecting to tpm simulator.");
      }
      shutdown(__fd,2);
      close(__fd);
    }
    free(__ptr);
  }
  return (TPM_SOCKET_HANDLE)0x0;
}

Assistant:

TPM_SOCKET_HANDLE tpm_socket_create(const char* address, unsigned short port)
{
    TPM_SOCKET_INFO* result;
    if ((result = malloc(sizeof(TPM_SOCKET_INFO))) == NULL)
    {
        LogError("Failure: malloc socket communication info.");
    }
    else
    {
#ifdef WIN32
        WSADATA wsaData;
        WSAStartup(MAKEWORD(2, 0), &wsaData);
#endif

        memset(result, 0, sizeof(TPM_SOCKET_INFO));

        if ((result->socket_conn = socket(AF_INET, SOCK_STREAM, 0)) == INVALID_SOCKET)
        {
            LogError("Failure: connecting to tpm simulator.");
            free(result);
            result = NULL;
        }
        else
        {
            struct sockaddr_in SockAddr;
            memset(&SockAddr, 0, sizeof(SockAddr));
            SockAddr.sin_family = AF_INET;
            SockAddr.sin_port = htons(port);
            SockAddr.sin_addr.s_addr = inet_addr(address);

            if (connect(result->socket_conn, (struct sockaddr*)&SockAddr, sizeof(SockAddr)) < 0)
            {
                LogError("Failure: connecting to tpm simulator.");
                close_socket(result->socket_conn);
                free(result);
                result = NULL;
            }
        }
    }
    return result;
}